

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  uint uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  uint uVar34;
  long lVar35;
  long lVar36;
  byte bVar37;
  byte bVar38;
  uint uVar39;
  ulong uVar40;
  RTCIntersectArguments *pRVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  bool bVar46;
  uint uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  float fVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined4 uVar82;
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [32];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  long lStack_2808;
  ulong *local_27e8;
  int local_27ac;
  RTCIntersectArguments *local_27a8;
  ulong local_27a0;
  long local_2798;
  long local_2790;
  Scene *local_2788;
  RTCFilterFunctionNArguments local_2780;
  float local_2750;
  undefined4 local_274c;
  undefined4 local_2748;
  undefined4 local_2744;
  undefined4 local_2740;
  undefined4 local_273c;
  uint local_2738;
  uint local_2734;
  uint local_2730;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar50 [16];
  undefined1 auVar58 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_27e8 = local_2390;
    local_2398[0] = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar15 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar48._8_4_ = 0x7fffffff;
    auVar48._0_8_ = 0x7fffffff7fffffff;
    auVar48._12_4_ = 0x7fffffff;
    auVar48 = vandps_avx512vl((undefined1  [16])aVar2,auVar48);
    auVar49._8_4_ = 0x219392ef;
    auVar49._0_8_ = 0x219392ef219392ef;
    auVar49._12_4_ = 0x219392ef;
    uVar40 = vcmpps_avx512vl(auVar48,auVar49,1);
    auVar84._8_4_ = 0x3f800000;
    auVar84._0_8_ = 0x3f8000003f800000;
    auVar84._12_4_ = 0x3f800000;
    auVar48 = vdivps_avx(auVar84,(undefined1  [16])aVar2);
    auVar49 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar46 = (bool)((byte)uVar40 & 1);
    auVar50._0_4_ = (uint)bVar46 * auVar49._0_4_ | (uint)!bVar46 * auVar48._0_4_;
    bVar46 = (bool)((byte)(uVar40 >> 1) & 1);
    auVar50._4_4_ = (uint)bVar46 * auVar49._4_4_ | (uint)!bVar46 * auVar48._4_4_;
    bVar46 = (bool)((byte)(uVar40 >> 2) & 1);
    auVar50._8_4_ = (uint)bVar46 * auVar49._8_4_ | (uint)!bVar46 * auVar48._8_4_;
    bVar46 = (bool)((byte)(uVar40 >> 3) & 1);
    auVar50._12_4_ = (uint)bVar46 * auVar49._12_4_ | (uint)!bVar46 * auVar48._12_4_;
    auVar51._8_4_ = 0x3f7ffffa;
    auVar51._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar51._12_4_ = 0x3f7ffffa;
    auVar51 = vmulps_avx512vl(auVar50,auVar51);
    auVar52._8_4_ = 0x3f800003;
    auVar52._0_8_ = 0x3f8000033f800003;
    auVar52._12_4_ = 0x3f800003;
    auVar52 = vmulps_avx512vl(auVar50,auVar52);
    local_2680 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar103 = ZEXT3264(local_2680);
    local_26a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar104 = ZEXT3264(local_26a0);
    local_26c0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar105 = ZEXT3264(local_26c0);
    local_26e0 = vbroadcastss_avx512vl(auVar51);
    auVar106 = ZEXT3264(local_26e0);
    auVar48 = vmovshdup_avx(auVar51);
    local_2700 = vbroadcastsd_avx512vl(auVar48);
    auVar107 = ZEXT3264(local_2700);
    auVar54._8_4_ = 2;
    auVar54._0_8_ = 0x200000002;
    auVar54._12_4_ = 2;
    auVar54._16_4_ = 2;
    auVar54._20_4_ = 2;
    auVar54._24_4_ = 2;
    auVar54._28_4_ = 2;
    auVar49 = vshufpd_avx(auVar51,auVar51,1);
    local_2720 = vpermps_avx512vl(auVar54,ZEXT1632(auVar51));
    auVar108 = ZEXT3264(local_2720);
    fVar78 = auVar52._0_4_;
    auVar53._8_4_ = 1;
    auVar53._0_8_ = 0x100000001;
    auVar53._12_4_ = 1;
    auVar53._16_4_ = 1;
    auVar53._20_4_ = 1;
    auVar53._24_4_ = 1;
    auVar53._28_4_ = 1;
    local_25c0 = vpermps_avx2(auVar53,ZEXT1632(auVar52));
    auVar98 = ZEXT3264(local_25c0);
    local_25e0 = vpermps_avx2(auVar54,ZEXT1632(auVar52));
    auVar99 = ZEXT3264(local_25e0);
    uVar42 = (ulong)(auVar51._0_4_ < 0.0) * 0x20;
    uVar43 = (ulong)(auVar48._0_4_ < 0.0) << 5 | 0x40;
    uVar40 = (ulong)(auVar49._0_4_ < 0.0) << 5 | 0x80;
    uVar44 = uVar40 ^ 0x20;
    uVar82 = auVar14._0_4_;
    local_2600._4_4_ = uVar82;
    local_2600._0_4_ = uVar82;
    local_2600._8_4_ = uVar82;
    local_2600._12_4_ = uVar82;
    local_2600._16_4_ = uVar82;
    local_2600._20_4_ = uVar82;
    local_2600._24_4_ = uVar82;
    local_2600._28_4_ = uVar82;
    auVar100 = ZEXT3264(local_2600);
    uVar82 = auVar15._0_4_;
    auVar81 = ZEXT3264(CONCAT428(uVar82,CONCAT424(uVar82,CONCAT420(uVar82,CONCAT416(uVar82,CONCAT412
                                                  (uVar82,CONCAT48(uVar82,CONCAT44(uVar82,uVar82))))
                                                  ))));
    auVar53 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar101 = ZEXT3264(auVar53);
    auVar102 = ZEXT3264(CONCAT428(0xfffffff8,
                                  CONCAT424(0xfffffff8,
                                            CONCAT420(0xfffffff8,
                                                      CONCAT416(0xfffffff8,
                                                                CONCAT412(0xfffffff8,
                                                                          CONCAT48(0xfffffff8,
                                                                                                                                                                      
                                                  0xfffffff8fffffff8)))))));
    local_25a0 = fVar78;
    fStack_259c = fVar78;
    fStack_2598 = fVar78;
    fStack_2594 = fVar78;
    fStack_2590 = fVar78;
    fStack_258c = fVar78;
    fStack_2588 = fVar78;
    fStack_2584 = fVar78;
    local_27a0 = uVar40;
    fVar92 = fVar78;
    fVar93 = fVar78;
    fVar94 = fVar78;
    fVar95 = fVar78;
    fVar96 = fVar78;
    fVar97 = fVar78;
LAB_01c6d684:
    if (local_27e8 != &local_23a0) {
      pfVar4 = (float *)(local_27e8 + -1);
      local_27e8 = local_27e8 + -2;
      if (*pfVar4 <= (ray->super_RayK<1>).tfar) {
        uVar45 = *local_27e8;
LAB_01c6d6ae:
        do {
          if ((uVar45 & 8) != 0) goto LAB_01c6da70;
          auVar53 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar42),auVar103._0_32_);
          auVar53 = vmulps_avx512vl(auVar106._0_32_,auVar53);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar43),auVar104._0_32_);
          auVar54 = vmulps_avx512vl(auVar107._0_32_,auVar54);
          auVar53 = vmaxps_avx(auVar53,auVar54);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar40),auVar105._0_32_);
          auVar54 = vmulps_avx512vl(auVar108._0_32_,auVar54);
          auVar54 = vmaxps_avx(auVar54,auVar100._0_32_);
          auVar53 = vmaxps_avx(auVar53,auVar54);
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar45 + 0x40 + (uVar42 ^ 0x20)),
                                    auVar103._0_32_);
          auVar28._4_4_ = fVar92 * auVar54._4_4_;
          auVar28._0_4_ = fVar78 * auVar54._0_4_;
          auVar28._8_4_ = fVar93 * auVar54._8_4_;
          auVar28._12_4_ = fVar94 * auVar54._12_4_;
          auVar28._16_4_ = fVar95 * auVar54._16_4_;
          auVar28._20_4_ = fVar96 * auVar54._20_4_;
          auVar28._24_4_ = fVar97 * auVar54._24_4_;
          auVar28._28_4_ = auVar54._28_4_;
          auVar54 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar45 + 0x40 + (uVar43 ^ 0x20)),
                                    auVar104._0_32_);
          auVar29._4_4_ = auVar98._4_4_ * auVar54._4_4_;
          auVar29._0_4_ = auVar98._0_4_ * auVar54._0_4_;
          auVar29._8_4_ = auVar98._8_4_ * auVar54._8_4_;
          auVar29._12_4_ = auVar98._12_4_ * auVar54._12_4_;
          auVar29._16_4_ = auVar98._16_4_ * auVar54._16_4_;
          auVar29._20_4_ = auVar98._20_4_ * auVar54._20_4_;
          auVar29._24_4_ = auVar98._24_4_ * auVar54._24_4_;
          auVar29._28_4_ = auVar54._28_4_;
          auVar54 = vminps_avx(auVar28,auVar29);
          auVar55 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar44),auVar105._0_32_);
          auVar30._4_4_ = auVar99._4_4_ * auVar55._4_4_;
          auVar30._0_4_ = auVar99._0_4_ * auVar55._0_4_;
          auVar30._8_4_ = auVar99._8_4_ * auVar55._8_4_;
          auVar30._12_4_ = auVar99._12_4_ * auVar55._12_4_;
          auVar30._16_4_ = auVar99._16_4_ * auVar55._16_4_;
          auVar30._20_4_ = auVar99._20_4_ * auVar55._20_4_;
          auVar30._24_4_ = auVar99._24_4_ * auVar55._24_4_;
          auVar30._28_4_ = auVar55._28_4_;
          auVar55 = vminps_avx(auVar30,auVar81._0_32_);
          auVar54 = vminps_avx(auVar54,auVar55);
          uVar16 = vcmpps_avx512vl(auVar53,auVar54,2);
          bVar38 = (byte)uVar16;
          if (bVar38 == 0) break;
          auVar54 = *(undefined1 (*) [32])(uVar45 & 0xfffffffffffffff0);
          auVar55 = ((undefined1 (*) [32])(uVar45 & 0xfffffffffffffff0))[1];
          auVar56 = vpternlogd_avx512vl(auVar101._0_32_,auVar53,auVar102._0_32_,0xf8);
          auVar57 = vpcompressd_avx512vl(auVar56);
          auVar58._0_4_ =
               (uint)(bVar38 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar38 & 1) * auVar56._0_4_;
          bVar46 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar58._4_4_ = (uint)bVar46 * auVar57._4_4_ | (uint)!bVar46 * auVar56._4_4_;
          bVar46 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar58._8_4_ = (uint)bVar46 * auVar57._8_4_ | (uint)!bVar46 * auVar56._8_4_;
          bVar46 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar58._12_4_ = (uint)bVar46 * auVar57._12_4_ | (uint)!bVar46 * auVar56._12_4_;
          bVar46 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar58._16_4_ = (uint)bVar46 * auVar57._16_4_ | (uint)!bVar46 * auVar56._16_4_;
          bVar46 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar58._20_4_ = (uint)bVar46 * auVar57._20_4_ | (uint)!bVar46 * auVar56._20_4_;
          bVar46 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar58._24_4_ = (uint)bVar46 * auVar57._24_4_ | (uint)!bVar46 * auVar56._24_4_;
          bVar46 = SUB81(uVar16 >> 7,0);
          auVar58._28_4_ = (uint)bVar46 * auVar57._28_4_ | (uint)!bVar46 * auVar56._28_4_;
          auVar56 = vpermt2q_avx512vl(auVar54,auVar58,auVar55);
          uVar45 = auVar56._0_8_;
          bVar38 = bVar38 - 1 & bVar38;
          if (bVar38 != 0) {
            auVar56 = vpshufd_avx2(auVar58,0x55);
            vpermt2q_avx512vl(auVar54,auVar56,auVar55);
            auVar57 = vpminsd_avx2(auVar58,auVar56);
            auVar56 = vpmaxsd_avx2(auVar58,auVar56);
            bVar38 = bVar38 - 1 & bVar38;
            if (bVar38 == 0) {
              auVar57 = vpermi2q_avx512vl(auVar57,auVar54,auVar55);
              uVar45 = auVar57._0_8_;
              auVar54 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
              *local_27e8 = auVar54._0_8_;
              lVar35 = 8;
              lStack_2808 = 0x10;
            }
            else {
              auVar64 = vpshufd_avx2(auVar58,0xaa);
              vpermt2q_avx512vl(auVar54,auVar64,auVar55);
              auVar59 = vpminsd_avx2(auVar57,auVar64);
              auVar57 = vpmaxsd_avx2(auVar57,auVar64);
              auVar64 = vpminsd_avx2(auVar56,auVar57);
              auVar57 = vpmaxsd_avx2(auVar56,auVar57);
              bVar38 = bVar38 - 1 & bVar38;
              if (bVar38 == 0) {
                auVar56 = vpermi2q_avx512vl(auVar59,auVar54,auVar55);
                uVar45 = auVar56._0_8_;
                auVar56 = vpermt2q_avx512vl(auVar54,auVar57,auVar55);
                *local_27e8 = auVar56._0_8_;
                auVar56 = vpermd_avx2(auVar57,auVar53);
                *(int *)(local_27e8 + 1) = auVar56._0_4_;
                auVar54 = vpermt2q_avx512vl(auVar54,auVar64,auVar55);
                local_27e8[2] = auVar54._0_8_;
                lStack_2808 = 0x18;
                lVar35 = lStack_2808;
                lStack_2808 = 0x20;
                auVar56 = auVar64;
              }
              else {
                auVar56 = vpshufd_avx2(auVar58,0xff);
                vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                auVar61 = vpminsd_avx2(auVar59,auVar56);
                auVar59 = vpmaxsd_avx2(auVar59,auVar56);
                auVar56 = vpminsd_avx2(auVar64,auVar59);
                auVar59 = vpmaxsd_avx2(auVar64,auVar59);
                auVar64 = vpminsd_avx2(auVar57,auVar59);
                auVar57 = vpmaxsd_avx2(auVar57,auVar59);
                bVar38 = bVar38 - 1 & bVar38;
                if (bVar38 != 0) {
                  auVar60 = valignd_avx512vl(auVar58,auVar58,3);
                  auVar59 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar61 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar59,auVar61);
                  auVar59 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar56 = vpermt2d_avx512vl(auVar61,auVar59,auVar56);
                  auVar59 = vpermt2d_avx512vl(auVar56,auVar59,auVar64);
                  auVar56 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar56 = vpermt2d_avx512vl(auVar59,auVar56,auVar57);
                  auVar103 = ZEXT3264(auVar56);
                  bVar37 = bVar38;
                  do {
                    auVar57 = auVar103._0_32_;
                    auVar85._8_4_ = 1;
                    auVar85._0_8_ = 0x100000001;
                    auVar85._12_4_ = 1;
                    auVar85._16_4_ = 1;
                    auVar85._20_4_ = 1;
                    auVar85._24_4_ = 1;
                    auVar85._28_4_ = 1;
                    auVar56 = vpermd_avx2(auVar85,auVar60);
                    auVar60 = valignd_avx512vl(auVar60,auVar60,1);
                    vpermt2q_avx512vl(auVar54,auVar60,auVar55);
                    bVar37 = bVar37 - 1 & bVar37;
                    uVar20 = vpcmpd_avx512vl(auVar56,auVar57,5);
                    auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                    bVar21 = (byte)uVar20 << 1;
                    auVar57 = valignd_avx512vl(auVar57,auVar57,7);
                    bVar46 = (bool)((byte)uVar20 & 1);
                    bVar9 = (bool)(bVar21 >> 2 & 1);
                    bVar10 = (bool)(bVar21 >> 3 & 1);
                    bVar11 = (bool)(bVar21 >> 4 & 1);
                    bVar12 = (bool)(bVar21 >> 5 & 1);
                    bVar13 = (bool)(bVar21 >> 6 & 1);
                    auVar103 = ZEXT3264(CONCAT428((uint)(bVar21 >> 7) * auVar57._28_4_ |
                                                  (uint)!(bool)(bVar21 >> 7) * auVar56._28_4_,
                                                  CONCAT424((uint)bVar13 * auVar57._24_4_ |
                                                            (uint)!bVar13 * auVar56._24_4_,
                                                            CONCAT420((uint)bVar12 * auVar57._20_4_
                                                                      | (uint)!bVar12 *
                                                                        auVar56._20_4_,
                                                                      CONCAT416((uint)bVar11 *
                                                                                auVar57._16_4_ |
                                                                                (uint)!bVar11 *
                                                                                auVar56._16_4_,
                                                                                CONCAT412((uint)
                                                  bVar10 * auVar57._12_4_ |
                                                  (uint)!bVar10 * auVar56._12_4_,
                                                  CONCAT48((uint)bVar9 * auVar57._8_4_ |
                                                           (uint)!bVar9 * auVar56._8_4_,
                                                           CONCAT44((uint)bVar46 * auVar57._4_4_ |
                                                                    (uint)!bVar46 * auVar56._4_4_,
                                                                    auVar56._0_4_))))))));
                  } while (bVar37 != 0);
                  lVar35 = (ulong)(uint)POPCOUNT((uint)bVar38) + 3;
                  while( true ) {
                    auVar57 = auVar103._0_32_;
                    auVar56 = vpermt2q_avx512vl(auVar54,auVar57,auVar55);
                    uVar45 = auVar56._0_8_;
                    bVar46 = lVar35 == 0;
                    lVar35 = lVar35 + -1;
                    if (bVar46) break;
                    *local_27e8 = uVar45;
                    auVar56 = vpermd_avx2(auVar57,auVar53);
                    *(int *)(local_27e8 + 1) = auVar56._0_4_;
                    auVar56 = valignd_avx512vl(auVar57,auVar57,1);
                    auVar103 = ZEXT3264(auVar56);
                    local_27e8 = local_27e8 + 2;
                  }
                  auVar103 = ZEXT3264(local_2680);
                  auVar104 = ZEXT3264(local_26a0);
                  auVar105 = ZEXT3264(local_26c0);
                  auVar106 = ZEXT3264(local_26e0);
                  auVar107 = ZEXT3264(local_2700);
                  auVar108 = ZEXT3264(local_2720);
                  goto LAB_01c6d6ae;
                }
                auVar59 = vpermi2q_avx512vl(auVar61,auVar54,auVar55);
                uVar45 = auVar59._0_8_;
                auVar59 = vpermt2q_avx512vl(auVar54,auVar57,auVar55);
                *local_27e8 = auVar59._0_8_;
                auVar57 = vpermd_avx2(auVar57,auVar53);
                *(int *)(local_27e8 + 1) = auVar57._0_4_;
                auVar57 = vpermt2q_avx512vl(auVar54,auVar64,auVar55);
                local_27e8[2] = auVar57._0_8_;
                auVar57 = vpermd_avx2(auVar64,auVar53);
                *(int *)(local_27e8 + 3) = auVar57._0_4_;
                auVar54 = vpermt2q_avx512vl(auVar54,auVar56,auVar55);
                local_27e8[4] = auVar54._0_8_;
                lVar35 = 0x28;
                lStack_2808 = 0x30;
              }
            }
            auVar53 = vpermd_avx2(auVar56,auVar53);
            *(int *)((long)local_27e8 + lVar35) = auVar53._0_4_;
            local_27e8 = (ulong *)((long)local_27e8 + lStack_2808);
          }
        } while( true );
      }
      goto LAB_01c6d684;
    }
  }
  return;
LAB_01c6da70:
  local_2798 = (ulong)((uint)uVar45 & 0xf) - 8;
  uVar45 = uVar45 & 0xfffffffffffffff0;
  for (local_2790 = 0; local_2790 != local_2798; local_2790 = local_2790 + 1) {
    lVar36 = local_2790 * 0x60;
    local_2788 = context->scene;
    ppfVar3 = (context->scene->vertices).items;
    pfVar4 = ppfVar3[*(uint *)(uVar45 + 0x48 + lVar36)];
    auVar55._16_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x28 + lVar36));
    auVar55._0_16_ = *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 8 + lVar36));
    pfVar5 = ppfVar3[*(uint *)(uVar45 + 0x40 + lVar36)];
    auVar62._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + 0x20 + lVar36));
    auVar62._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + lVar36));
    pfVar6 = ppfVar3[*(uint *)(uVar45 + 0x4c + lVar36)];
    auVar63._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x2c + lVar36));
    auVar63._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0xc + lVar36));
    pfVar7 = ppfVar3[*(uint *)(uVar45 + 0x44 + lVar36)];
    auVar70._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x24 + lVar36));
    auVar70._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 4 + lVar36));
    lVar35 = uVar45 + 0x40 + lVar36;
    local_2580 = *(undefined8 *)(lVar35 + 0x10);
    uStack_2578 = *(undefined8 *)(lVar35 + 0x18);
    uStack_2570 = local_2580;
    uStack_2568 = uStack_2578;
    lVar35 = uVar45 + 0x50 + lVar36;
    local_2620 = *(undefined8 *)(lVar35 + 0x10);
    uStack_2618 = *(undefined8 *)(lVar35 + 0x18);
    auVar15 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + 0x10 + lVar36)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x18 + lVar36)));
    auVar48 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + 0x10 + lVar36)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x18 + lVar36)));
    auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x14 + lVar36)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x1c + lVar36)));
    auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x14 + lVar36)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x1c + lVar36)));
    auVar51 = vunpcklps_avx(auVar48,auVar14);
    auVar52 = vunpcklps_avx(auVar15,auVar49);
    auVar48 = vunpckhps_avx(auVar15,auVar49);
    auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + 0x30 + lVar36)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x38 + lVar36)));
    auVar14 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar45 + 0x30 + lVar36)),
                            *(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar45 + 0x38 + lVar36)));
    auVar50 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x34 + lVar36)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x3c + lVar36)));
    auVar15 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x34 + lVar36)),
                            *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar45 + 0x3c + lVar36)));
    auVar15 = vunpcklps_avx(auVar14,auVar15);
    auVar84 = vunpcklps_avx(auVar49,auVar50);
    auVar14 = vunpckhps_avx(auVar49,auVar50);
    uStack_2610 = local_2620;
    uStack_2608 = uStack_2618;
    auVar53 = vunpcklps_avx(auVar70,auVar63);
    auVar54 = vunpcklps_avx(auVar62,auVar55);
    auVar56 = vunpcklps_avx(auVar54,auVar53);
    auVar54 = vunpckhps_avx(auVar54,auVar53);
    auVar53 = vunpckhps_avx(auVar70,auVar63);
    auVar55 = vunpckhps_avx(auVar62,auVar55);
    auVar55 = vunpcklps_avx(auVar55,auVar53);
    auVar68._16_16_ = auVar52;
    auVar68._0_16_ = auVar52;
    auVar69._16_16_ = auVar48;
    auVar69._0_16_ = auVar48;
    auVar66._16_16_ = auVar51;
    auVar66._0_16_ = auVar51;
    auVar71._16_16_ = auVar84;
    auVar71._0_16_ = auVar84;
    auVar72._16_16_ = auVar14;
    auVar72._0_16_ = auVar14;
    uVar82 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    auVar73._4_4_ = uVar82;
    auVar73._0_4_ = uVar82;
    auVar73._8_4_ = uVar82;
    auVar73._12_4_ = uVar82;
    auVar73._16_4_ = uVar82;
    auVar73._20_4_ = uVar82;
    auVar73._24_4_ = uVar82;
    auVar73._28_4_ = uVar82;
    auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar59 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    uVar82 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    auVar86._4_4_ = uVar82;
    auVar86._0_4_ = uVar82;
    auVar86._8_4_ = uVar82;
    auVar86._12_4_ = uVar82;
    auVar86._16_4_ = uVar82;
    auVar86._20_4_ = uVar82;
    auVar86._24_4_ = uVar82;
    auVar86._28_4_ = uVar82;
    auVar67._16_16_ = auVar15;
    auVar67._0_16_ = auVar15;
    uVar82 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    auVar89._4_4_ = uVar82;
    auVar89._0_4_ = uVar82;
    auVar89._8_4_ = uVar82;
    auVar89._12_4_ = uVar82;
    auVar89._16_4_ = uVar82;
    auVar89._20_4_ = uVar82;
    auVar89._24_4_ = uVar82;
    auVar89._28_4_ = uVar82;
    fVar92 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar91._4_4_ = fVar92;
    auVar91._0_4_ = fVar92;
    auVar91._8_4_ = fVar92;
    auVar91._12_4_ = fVar92;
    auVar91._16_4_ = fVar92;
    auVar91._20_4_ = fVar92;
    auVar91._24_4_ = fVar92;
    auVar91._28_4_ = fVar92;
    auVar53 = vsubps_avx(auVar56,auVar73);
    auVar62 = vsubps_avx512vl(auVar54,auVar57);
    auVar63 = vsubps_avx512vl(auVar55,auVar59);
    auVar64 = vsubps_avx512vl(auVar68,auVar73);
    auVar65 = vsubps_avx512vl(auVar69,auVar57);
    auVar66 = vsubps_avx512vl(auVar66,auVar59);
    auVar54 = vsubps_avx(auVar71,auVar73);
    auVar57 = vsubps_avx512vl(auVar72,auVar57);
    auVar59 = vsubps_avx512vl(auVar67,auVar59);
    auVar55 = vsubps_avx(auVar54,auVar53);
    auVar56 = vsubps_avx(auVar57,auVar62);
    auVar67 = vsubps_avx512vl(auVar59,auVar63);
    auVar68 = vsubps_avx512vl(auVar53,auVar64);
    auVar69 = vsubps_avx512vl(auVar62,auVar65);
    auVar70 = vsubps_avx512vl(auVar63,auVar66);
    auVar71 = vsubps_avx512vl(auVar64,auVar54);
    auVar72 = vsubps_avx512vl(auVar65,auVar57);
    auVar73 = vsubps_avx512vl(auVar66,auVar59);
    auVar75._0_4_ = auVar54._0_4_ + auVar53._0_4_;
    auVar75._4_4_ = auVar54._4_4_ + auVar53._4_4_;
    auVar75._8_4_ = auVar54._8_4_ + auVar53._8_4_;
    auVar75._12_4_ = auVar54._12_4_ + auVar53._12_4_;
    auVar75._16_4_ = auVar54._16_4_ + auVar53._16_4_;
    auVar75._20_4_ = auVar54._20_4_ + auVar53._20_4_;
    auVar75._24_4_ = auVar54._24_4_ + auVar53._24_4_;
    auVar75._28_4_ = auVar54._28_4_ + auVar53._28_4_;
    auVar88._0_4_ = auVar57._0_4_ + auVar62._0_4_;
    auVar88._4_4_ = auVar57._4_4_ + auVar62._4_4_;
    auVar88._8_4_ = auVar57._8_4_ + auVar62._8_4_;
    auVar88._12_4_ = auVar57._12_4_ + auVar62._12_4_;
    auVar88._16_4_ = auVar57._16_4_ + auVar62._16_4_;
    auVar88._20_4_ = auVar57._20_4_ + auVar62._20_4_;
    auVar88._24_4_ = auVar57._24_4_ + auVar62._24_4_;
    auVar88._28_4_ = auVar57._28_4_ + auVar62._28_4_;
    auVar61 = vaddps_avx512vl(auVar59,auVar63);
    auVar60 = vmulps_avx512vl(auVar88,auVar67);
    auVar60 = vfmsub231ps_avx512vl(auVar60,auVar56,auVar61);
    auVar61 = vmulps_avx512vl(auVar61,auVar55);
    auVar74 = vfmsub231ps_avx512vl(auVar61,auVar67,auVar75);
    auVar61._4_4_ = auVar56._4_4_ * auVar75._4_4_;
    auVar61._0_4_ = auVar56._0_4_ * auVar75._0_4_;
    auVar61._8_4_ = auVar56._8_4_ * auVar75._8_4_;
    auVar61._12_4_ = auVar56._12_4_ * auVar75._12_4_;
    auVar61._16_4_ = auVar56._16_4_ * auVar75._16_4_;
    auVar61._20_4_ = auVar56._20_4_ * auVar75._20_4_;
    auVar61._24_4_ = auVar56._24_4_ * auVar75._24_4_;
    auVar61._28_4_ = auVar75._28_4_;
    auVar48 = vfmsub231ps_fma(auVar61,auVar55,auVar88);
    auVar83._0_4_ = fVar92 * auVar48._0_4_;
    auVar83._4_4_ = fVar92 * auVar48._4_4_;
    auVar83._8_4_ = fVar92 * auVar48._8_4_;
    auVar83._12_4_ = fVar92 * auVar48._12_4_;
    auVar83._16_4_ = fVar92 * 0.0;
    auVar83._20_4_ = fVar92 * 0.0;
    auVar83._24_4_ = fVar92 * 0.0;
    auVar83._28_4_ = 0;
    auVar61 = vfmadd231ps_avx512vl(auVar83,auVar89,auVar74);
    local_2560 = vfmadd231ps_avx512vl(auVar61,auVar86,auVar60);
    auVar61 = vaddps_avx512vl(auVar53,auVar64);
    auVar60 = vaddps_avx512vl(auVar62,auVar65);
    auVar74 = vaddps_avx512vl(auVar63,auVar66);
    auVar75 = vmulps_avx512vl(auVar60,auVar70);
    auVar75 = vfmsub231ps_avx512vl(auVar75,auVar69,auVar74);
    auVar74 = vmulps_avx512vl(auVar74,auVar68);
    auVar74 = vfmsub231ps_avx512vl(auVar74,auVar70,auVar61);
    auVar61 = vmulps_avx512vl(auVar61,auVar69);
    auVar61 = vfmsub231ps_avx512vl(auVar61,auVar68,auVar60);
    auVar60._4_4_ = fVar92 * auVar61._4_4_;
    auVar60._0_4_ = fVar92 * auVar61._0_4_;
    auVar60._8_4_ = fVar92 * auVar61._8_4_;
    auVar60._12_4_ = fVar92 * auVar61._12_4_;
    auVar60._16_4_ = fVar92 * auVar61._16_4_;
    auVar60._20_4_ = fVar92 * auVar61._20_4_;
    auVar60._24_4_ = fVar92 * auVar61._24_4_;
    auVar60._28_4_ = auVar61._28_4_;
    auVar61 = vfmadd231ps_avx512vl(auVar60,auVar89,auVar74);
    local_2540 = vfmadd231ps_avx512vl(auVar61,auVar86,auVar75);
    auVar54 = vaddps_avx512vl(auVar64,auVar54);
    auVar57 = vaddps_avx512vl(auVar65,auVar57);
    auVar59 = vaddps_avx512vl(auVar66,auVar59);
    auVar64 = vmulps_avx512vl(auVar57,auVar73);
    auVar64 = vfmsub231ps_avx512vl(auVar64,auVar72,auVar59);
    auVar59 = vmulps_avx512vl(auVar59,auVar71);
    auVar59 = vfmsub231ps_avx512vl(auVar59,auVar73,auVar54);
    auVar65._4_4_ = auVar54._4_4_ * auVar72._4_4_;
    auVar65._0_4_ = auVar54._0_4_ * auVar72._0_4_;
    auVar65._8_4_ = auVar54._8_4_ * auVar72._8_4_;
    auVar65._12_4_ = auVar54._12_4_ * auVar72._12_4_;
    auVar65._16_4_ = auVar54._16_4_ * auVar72._16_4_;
    auVar65._20_4_ = auVar54._20_4_ * auVar72._20_4_;
    auVar65._24_4_ = auVar54._24_4_ * auVar72._24_4_;
    auVar65._28_4_ = auVar54._28_4_;
    auVar48 = vfmsub231ps_fma(auVar65,auVar71,auVar57);
    auVar54 = vmulps_avx512vl(auVar91,ZEXT1632(auVar48));
    auVar54 = vfmadd231ps_avx512vl(auVar54,auVar89,auVar59);
    auVar54 = vfmadd231ps_avx512vl(auVar54,auVar86,auVar64);
    auVar74._0_4_ = local_2560._0_4_ + local_2540._0_4_;
    auVar74._4_4_ = local_2560._4_4_ + local_2540._4_4_;
    auVar74._8_4_ = local_2560._8_4_ + local_2540._8_4_;
    auVar74._12_4_ = local_2560._12_4_ + local_2540._12_4_;
    auVar74._16_4_ = local_2560._16_4_ + local_2540._16_4_;
    auVar74._20_4_ = local_2560._20_4_ + local_2540._20_4_;
    auVar74._24_4_ = local_2560._24_4_ + local_2540._24_4_;
    auVar74._28_4_ = local_2560._28_4_ + local_2540._28_4_;
    local_2520 = vaddps_avx512vl(auVar54,auVar74);
    auVar57._8_4_ = 0x7fffffff;
    auVar57._0_8_ = 0x7fffffff7fffffff;
    auVar57._12_4_ = 0x7fffffff;
    auVar57._16_4_ = 0x7fffffff;
    auVar57._20_4_ = 0x7fffffff;
    auVar57._24_4_ = 0x7fffffff;
    auVar57._28_4_ = 0x7fffffff;
    vandps_avx512vl(local_2520,auVar57);
    auVar59._8_4_ = 0x34000000;
    auVar59._0_8_ = 0x3400000034000000;
    auVar59._12_4_ = 0x34000000;
    auVar59._16_4_ = 0x34000000;
    auVar59._20_4_ = 0x34000000;
    auVar59._24_4_ = 0x34000000;
    auVar59._28_4_ = 0x34000000;
    auVar57 = vmulps_avx512vl(local_2520,auVar59);
    auVar59 = vminps_avx512vl(local_2560,local_2540);
    auVar59 = vminps_avx512vl(auVar59,auVar54);
    auVar64._8_4_ = 0x80000000;
    auVar64._0_8_ = 0x8000000080000000;
    auVar64._12_4_ = 0x80000000;
    auVar64._16_4_ = 0x80000000;
    auVar64._20_4_ = 0x80000000;
    auVar64._24_4_ = 0x80000000;
    auVar64._28_4_ = 0x80000000;
    auVar64 = vxorps_avx512vl(auVar57,auVar64);
    uVar20 = vcmpps_avx512vl(auVar59,auVar64,5);
    auVar59 = vmaxps_avx512vl(local_2560,local_2540);
    auVar54 = vmaxps_avx512vl(auVar59,auVar54);
    uVar17 = vcmpps_avx512vl(auVar54,auVar57,2);
    local_24a0 = (byte)uVar20 | (byte)uVar17;
    if (local_24a0 != 0) {
      auVar54 = vmulps_avx512vl(auVar67,auVar69);
      auVar57 = vmulps_avx512vl(auVar55,auVar70);
      auVar59 = vmulps_avx512vl(auVar56,auVar68);
      auVar64 = vmulps_avx512vl(auVar70,auVar72);
      auVar61 = vmulps_avx512vl(auVar68,auVar73);
      auVar60 = vmulps_avx512vl(auVar69,auVar71);
      auVar56 = vfmsub213ps_avx512vl(auVar56,auVar70,auVar54);
      auVar65 = vfmsub213ps_avx512vl(auVar67,auVar68,auVar57);
      auVar55 = vfmsub213ps_avx512vl(auVar55,auVar69,auVar59);
      auVar66 = vfmsub213ps_avx512vl(auVar73,auVar69,auVar64);
      auVar67 = vfmsub213ps_avx512vl(auVar71,auVar70,auVar61);
      auVar68 = vfmsub213ps_avx512vl(auVar72,auVar68,auVar60);
      auVar69 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar54,auVar69);
      vandps_avx512vl(auVar64,auVar69);
      uVar40 = vcmpps_avx512vl(auVar69,auVar69,1);
      vandps_avx512vl(auVar57,auVar69);
      vandps_avx512vl(auVar61,auVar69);
      uVar16 = vcmpps_avx512vl(auVar69,auVar69,1);
      vandps_avx512vl(auVar59,auVar69);
      vandps_avx512vl(auVar60,auVar69);
      uVar18 = vcmpps_avx512vl(auVar69,auVar69,1);
      bVar46 = (bool)((byte)uVar40 & 1);
      local_2500._0_4_ = (float)((uint)bVar46 * auVar56._0_4_ | (uint)!bVar46 * auVar66._0_4_);
      bVar46 = (bool)((byte)(uVar40 >> 1) & 1);
      local_2500._4_4_ = (float)((uint)bVar46 * auVar56._4_4_ | (uint)!bVar46 * auVar66._4_4_);
      bVar46 = (bool)((byte)(uVar40 >> 2) & 1);
      local_2500._8_4_ = (float)((uint)bVar46 * auVar56._8_4_ | (uint)!bVar46 * auVar66._8_4_);
      bVar46 = (bool)((byte)(uVar40 >> 3) & 1);
      local_2500._12_4_ = (float)((uint)bVar46 * auVar56._12_4_ | (uint)!bVar46 * auVar66._12_4_);
      bVar46 = (bool)((byte)(uVar40 >> 4) & 1);
      local_2500._16_4_ = (float)((uint)bVar46 * auVar56._16_4_ | (uint)!bVar46 * auVar66._16_4_);
      bVar46 = (bool)((byte)(uVar40 >> 5) & 1);
      local_2500._20_4_ = (float)((uint)bVar46 * auVar56._20_4_ | (uint)!bVar46 * auVar66._20_4_);
      bVar46 = (bool)((byte)(uVar40 >> 6) & 1);
      local_2500._24_4_ = (float)((uint)bVar46 * auVar56._24_4_ | (uint)!bVar46 * auVar66._24_4_);
      bVar46 = SUB81(uVar40 >> 7,0);
      local_2500._28_4_ = (uint)bVar46 * auVar56._28_4_ | (uint)!bVar46 * auVar66._28_4_;
      bVar46 = (bool)((byte)uVar16 & 1);
      local_24e0._0_4_ = (float)((uint)bVar46 * auVar65._0_4_ | (uint)!bVar46 * auVar67._0_4_);
      bVar46 = (bool)((byte)(uVar16 >> 1) & 1);
      local_24e0._4_4_ = (float)((uint)bVar46 * auVar65._4_4_ | (uint)!bVar46 * auVar67._4_4_);
      bVar46 = (bool)((byte)(uVar16 >> 2) & 1);
      local_24e0._8_4_ = (float)((uint)bVar46 * auVar65._8_4_ | (uint)!bVar46 * auVar67._8_4_);
      bVar46 = (bool)((byte)(uVar16 >> 3) & 1);
      local_24e0._12_4_ = (float)((uint)bVar46 * auVar65._12_4_ | (uint)!bVar46 * auVar67._12_4_);
      bVar46 = (bool)((byte)(uVar16 >> 4) & 1);
      local_24e0._16_4_ = (float)((uint)bVar46 * auVar65._16_4_ | (uint)!bVar46 * auVar67._16_4_);
      bVar46 = (bool)((byte)(uVar16 >> 5) & 1);
      local_24e0._20_4_ = (float)((uint)bVar46 * auVar65._20_4_ | (uint)!bVar46 * auVar67._20_4_);
      bVar46 = (bool)((byte)(uVar16 >> 6) & 1);
      local_24e0._24_4_ = (float)((uint)bVar46 * auVar65._24_4_ | (uint)!bVar46 * auVar67._24_4_);
      bVar46 = SUB81(uVar16 >> 7,0);
      local_24e0._28_4_ = (uint)bVar46 * auVar65._28_4_ | (uint)!bVar46 * auVar67._28_4_;
      bVar46 = (bool)((byte)uVar18 & 1);
      local_24c0 = (float)((uint)bVar46 * auVar55._0_4_ | (uint)!bVar46 * auVar68._0_4_);
      bVar46 = (bool)((byte)(uVar18 >> 1) & 1);
      fStack_24bc = (float)((uint)bVar46 * auVar55._4_4_ | (uint)!bVar46 * auVar68._4_4_);
      bVar46 = (bool)((byte)(uVar18 >> 2) & 1);
      fStack_24b8 = (float)((uint)bVar46 * auVar55._8_4_ | (uint)!bVar46 * auVar68._8_4_);
      bVar46 = (bool)((byte)(uVar18 >> 3) & 1);
      fStack_24b4 = (float)((uint)bVar46 * auVar55._12_4_ | (uint)!bVar46 * auVar68._12_4_);
      bVar46 = (bool)((byte)(uVar18 >> 4) & 1);
      fStack_24b0 = (float)((uint)bVar46 * auVar55._16_4_ | (uint)!bVar46 * auVar68._16_4_);
      bVar46 = (bool)((byte)(uVar18 >> 5) & 1);
      fStack_24ac = (float)((uint)bVar46 * auVar55._20_4_ | (uint)!bVar46 * auVar68._20_4_);
      bVar46 = (bool)((byte)(uVar18 >> 6) & 1);
      fStack_24a8 = (float)((uint)bVar46 * auVar55._24_4_ | (uint)!bVar46 * auVar68._24_4_);
      bVar46 = SUB81(uVar18 >> 7,0);
      uStack_24a4 = (uint)bVar46 * auVar55._28_4_ | (uint)!bVar46 * auVar68._28_4_;
      auVar31._4_4_ = fVar92 * fStack_24bc;
      auVar31._0_4_ = fVar92 * local_24c0;
      auVar31._8_4_ = fVar92 * fStack_24b8;
      auVar31._12_4_ = fVar92 * fStack_24b4;
      auVar31._16_4_ = fVar92 * fStack_24b0;
      auVar31._20_4_ = fVar92 * fStack_24ac;
      auVar31._24_4_ = fVar92 * fStack_24a8;
      auVar31._28_4_ = fVar92;
      auVar48 = vfmadd213ps_fma(auVar89,local_24e0,auVar31);
      auVar48 = vfmadd213ps_fma(auVar86,local_2500,ZEXT1632(auVar48));
      auVar55 = ZEXT1632(CONCAT412(auVar48._12_4_ + auVar48._12_4_,
                                   CONCAT48(auVar48._8_4_ + auVar48._8_4_,
                                            CONCAT44(auVar48._4_4_ + auVar48._4_4_,
                                                     auVar48._0_4_ + auVar48._0_4_))));
      auVar90._0_4_ = auVar63._0_4_ * local_24c0;
      auVar90._4_4_ = auVar63._4_4_ * fStack_24bc;
      auVar90._8_4_ = auVar63._8_4_ * fStack_24b8;
      auVar90._12_4_ = auVar63._12_4_ * fStack_24b4;
      auVar90._16_4_ = auVar63._16_4_ * fStack_24b0;
      auVar90._20_4_ = auVar63._20_4_ * fStack_24ac;
      auVar90._24_4_ = auVar63._24_4_ * fStack_24a8;
      auVar90._28_4_ = 0;
      auVar48 = vfmadd213ps_fma(auVar62,local_24e0,auVar90);
      auVar14 = vfmadd213ps_fma(auVar53,local_2500,ZEXT1632(auVar48));
      auVar53 = vrcp14ps_avx512vl(auVar55);
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar56._16_4_ = 0x3f800000;
      auVar56._20_4_ = 0x3f800000;
      auVar56._24_4_ = 0x3f800000;
      auVar56._28_4_ = 0x3f800000;
      auVar54 = vfnmadd213ps_avx512vl(auVar53,auVar55,auVar56);
      auVar48 = vfmadd132ps_fma(auVar54,auVar53,auVar53);
      local_2440 = ZEXT1632(CONCAT412(auVar48._12_4_ * (auVar14._12_4_ + auVar14._12_4_),
                                      CONCAT48(auVar48._8_4_ * (auVar14._8_4_ + auVar14._8_4_),
                                               CONCAT44(auVar48._4_4_ *
                                                        (auVar14._4_4_ + auVar14._4_4_),
                                                        auVar48._0_4_ *
                                                        (auVar14._0_4_ + auVar14._0_4_)))));
      auVar81 = ZEXT3264(local_2440);
      uVar82 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar23._4_4_ = uVar82;
      auVar23._0_4_ = uVar82;
      auVar23._8_4_ = uVar82;
      auVar23._12_4_ = uVar82;
      auVar23._16_4_ = uVar82;
      auVar23._20_4_ = uVar82;
      auVar23._24_4_ = uVar82;
      auVar23._28_4_ = uVar82;
      uVar20 = vcmpps_avx512vl(local_2440,auVar23,0xd);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24._16_4_ = 0x80000000;
      auVar24._20_4_ = 0x80000000;
      auVar24._24_4_ = 0x80000000;
      auVar24._28_4_ = 0x80000000;
      auVar53 = vxorps_avx512vl(auVar55,auVar24);
      fVar92 = (ray->super_RayK<1>).tfar;
      auVar25._4_4_ = fVar92;
      auVar25._0_4_ = fVar92;
      auVar25._8_4_ = fVar92;
      auVar25._12_4_ = fVar92;
      auVar25._16_4_ = fVar92;
      auVar25._20_4_ = fVar92;
      auVar25._24_4_ = fVar92;
      auVar25._28_4_ = fVar92;
      uVar17 = vcmpps_avx512vl(local_2440,auVar25,2);
      uVar19 = vcmpps_avx512vl(auVar55,auVar53,4);
      local_24a0 = (byte)uVar20 & (byte)uVar17 & (byte)uVar19 & local_24a0;
      uVar47 = (uint)local_24a0;
      if (local_24a0 != 0) {
        auVar53 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
        auVar98 = ZEXT3264(auVar53);
        uVar34 = vextractps_avx(auVar53._0_16_,1);
        local_23c0 = 0xf0;
        auVar26._8_4_ = 0x219392ef;
        auVar26._0_8_ = 0x219392ef219392ef;
        auVar26._12_4_ = 0x219392ef;
        auVar26._16_4_ = 0x219392ef;
        auVar26._20_4_ = 0x219392ef;
        auVar26._24_4_ = 0x219392ef;
        auVar26._28_4_ = 0x219392ef;
        uVar40 = vcmpps_avx512vl(local_2520,auVar26,5);
        auVar54 = vrcp14ps_avx512vl(local_2520);
        auVar87._8_4_ = 0x3f800000;
        auVar87._0_8_ = 0x3f8000003f800000;
        auVar87._12_4_ = 0x3f800000;
        auVar87._16_4_ = 0x3f800000;
        auVar87._20_4_ = 0x3f800000;
        auVar87._24_4_ = 0x3f800000;
        auVar87._28_4_ = 0x3f800000;
        auVar48 = vfnmadd213ps_fma(local_2520,auVar54,auVar87);
        auVar53 = vfmadd132ps_avx512vl(ZEXT1632(auVar48),auVar54,auVar54);
        fVar93 = (float)((uint)((byte)uVar40 & 1) * auVar53._0_4_);
        fVar92 = (float)((uint)((byte)(uVar40 >> 1) & 1) * auVar53._4_4_);
        fVar94 = (float)((uint)((byte)(uVar40 >> 2) & 1) * auVar53._8_4_);
        fVar95 = (float)((uint)((byte)(uVar40 >> 3) & 1) * auVar53._12_4_);
        fVar78 = (float)((uint)((byte)(uVar40 >> 4) & 1) * auVar53._16_4_);
        fVar97 = (float)((uint)((byte)(uVar40 >> 5) & 1) * auVar53._20_4_);
        fVar96 = (float)((uint)((byte)(uVar40 >> 6) & 1) * auVar53._24_4_);
        auVar32._4_4_ = fVar92 * local_2560._4_4_;
        auVar32._0_4_ = fVar93 * local_2560._0_4_;
        auVar32._8_4_ = fVar94 * local_2560._8_4_;
        auVar32._12_4_ = fVar95 * local_2560._12_4_;
        auVar32._16_4_ = fVar78 * local_2560._16_4_;
        auVar32._20_4_ = fVar97 * local_2560._20_4_;
        auVar32._24_4_ = fVar96 * local_2560._24_4_;
        auVar32._28_4_ = local_2560._28_4_;
        auVar53 = vminps_avx(auVar32,auVar87);
        auVar33._4_4_ = fVar92 * local_2540._4_4_;
        auVar33._0_4_ = fVar93 * local_2540._0_4_;
        auVar33._8_4_ = fVar94 * local_2540._8_4_;
        auVar33._12_4_ = fVar95 * local_2540._12_4_;
        auVar33._16_4_ = fVar78 * local_2540._16_4_;
        auVar33._20_4_ = fVar97 * local_2540._20_4_;
        auVar33._24_4_ = fVar96 * local_2540._24_4_;
        auVar33._28_4_ = auVar54._28_4_;
        auVar54 = vminps_avx(auVar33,auVar87);
        auVar55 = vsubps_avx(auVar87,auVar53);
        auVar56 = vsubps_avx(auVar87,auVar54);
        local_2460 = vblendps_avx(auVar54,auVar55,0xf0);
        local_2480 = vblendps_avx(auVar53,auVar56,0xf0);
        fVar92 = (float)DAT_01fbac00;
        fVar93 = DAT_01fbac00._4_4_;
        fVar94 = DAT_01fbac00._8_4_;
        fVar95 = DAT_01fbac00._12_4_;
        fVar96 = DAT_01fbac00._16_4_;
        fVar97 = DAT_01fbac00._20_4_;
        fVar78 = DAT_01fbac00._24_4_;
        local_2420[0] = local_2500._0_4_ * fVar92;
        local_2420[1] = local_2500._4_4_ * fVar93;
        local_2420[2] = local_2500._8_4_ * fVar94;
        local_2420[3] = local_2500._12_4_ * fVar95;
        fStack_2410 = local_2500._16_4_ * fVar96;
        fStack_240c = local_2500._20_4_ * fVar97;
        fStack_2408 = local_2500._24_4_ * fVar78;
        uStack_2404 = local_2500._28_4_;
        local_2400[0] = local_24e0._0_4_ * fVar92;
        local_2400[1] = local_24e0._4_4_ * fVar93;
        local_2400[2] = local_24e0._8_4_ * fVar94;
        local_2400[3] = local_24e0._12_4_ * fVar95;
        fStack_23f0 = local_24e0._16_4_ * fVar96;
        fStack_23ec = local_24e0._20_4_ * fVar97;
        fStack_23e8 = local_24e0._24_4_ * fVar78;
        uStack_23e4 = local_24e0._28_4_;
        local_23e0[0] = local_24c0 * fVar92;
        local_23e0[1] = fStack_24bc * fVar93;
        local_23e0[2] = fStack_24b8 * fVar94;
        local_23e0[3] = fStack_24b4 * fVar95;
        fStack_23d0 = fStack_24b0 * fVar96;
        fStack_23cc = fStack_24ac * fVar97;
        fStack_23c8 = fStack_24a8 * fVar78;
        uStack_23c4 = uStack_24a4;
        auVar79._8_4_ = 0x7f800000;
        auVar79._0_8_ = 0x7f8000007f800000;
        auVar79._12_4_ = 0x7f800000;
        auVar79._16_4_ = 0x7f800000;
        auVar79._20_4_ = 0x7f800000;
        auVar79._24_4_ = 0x7f800000;
        auVar79._28_4_ = 0x7f800000;
        auVar53 = vblendmps_avx512vl(auVar79,local_2440);
        auVar76._0_4_ =
             (uint)(local_24a0 & 1) * auVar53._0_4_ | (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
        bVar46 = (bool)(local_24a0 >> 1 & 1);
        auVar76._4_4_ = (uint)bVar46 * auVar53._4_4_ | (uint)!bVar46 * 0x7f800000;
        bVar46 = (bool)(local_24a0 >> 2 & 1);
        auVar76._8_4_ = (uint)bVar46 * auVar53._8_4_ | (uint)!bVar46 * 0x7f800000;
        bVar46 = (bool)(local_24a0 >> 3 & 1);
        auVar76._12_4_ = (uint)bVar46 * auVar53._12_4_ | (uint)!bVar46 * 0x7f800000;
        bVar46 = (bool)(local_24a0 >> 4 & 1);
        auVar76._16_4_ = (uint)bVar46 * auVar53._16_4_ | (uint)!bVar46 * 0x7f800000;
        bVar46 = (bool)(local_24a0 >> 5 & 1);
        auVar76._20_4_ = (uint)bVar46 * auVar53._20_4_ | (uint)!bVar46 * 0x7f800000;
        bVar46 = (bool)(local_24a0 >> 6 & 1);
        auVar76._24_4_ = (uint)bVar46 * auVar53._24_4_ | (uint)!bVar46 * 0x7f800000;
        auVar76._28_4_ =
             (uint)(local_24a0 >> 7) * auVar53._28_4_ | (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
        auVar53 = vshufps_avx(auVar76,auVar76,0xb1);
        auVar53 = vminps_avx(auVar76,auVar53);
        auVar54 = vshufpd_avx(auVar53,auVar53,5);
        auVar53 = vminps_avx(auVar53,auVar54);
        auVar54 = vpermpd_avx2(auVar53,0x4e);
        auVar53 = vminps_avx(auVar53,auVar54);
        uVar20 = vcmpps_avx512vl(auVar76,auVar53,0);
        bVar38 = (byte)uVar20 & local_24a0;
        do {
          uVar39 = uVar47;
          if (bVar38 != 0) {
            uVar39 = (uint)bVar38;
          }
          uVar22 = 0;
          for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x80000000) {
            uVar22 = uVar22 + 1;
          }
          uVar39 = uVar22 & 0xff;
          local_2738 = *(uint *)((long)&local_2580 + (ulong)uVar39 * 4);
          pGVar8 = (local_2788->geometries).items[local_2738].ptr;
          if ((pGVar8->mask & uVar34) == 0) {
            uVar47 = (uint)(byte)(~(byte)(1 << (uVar22 & 0x1f)) & (byte)uVar47);
          }
          else {
            pRVar41 = context->args;
            local_2660 = auVar98._0_32_;
            if (pRVar41->filter == (RTCFilterFunctionN)0x0) {
              local_2780.context = context->user;
              if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar40 = (ulong)(uVar39 << 2);
                fVar92 = *(float *)(local_2480 + uVar40);
                fVar93 = *(float *)(local_2460 + uVar40);
                (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar40);
                (ray->Ng).field_0.field_0.x = *(float *)((long)local_2420 + uVar40);
                (ray->Ng).field_0.field_0.y = *(float *)((long)local_2400 + uVar40);
                (ray->Ng).field_0.field_0.z = *(float *)((long)local_23e0 + uVar40);
                ray->u = fVar92;
                ray->v = fVar93;
                ray->primID = *(uint *)((long)&local_2620 + uVar40);
                ray->geomID = local_2738;
                ray->instID[0] = (local_2780.context)->instID[0];
                ray->instPrimID[0] = (local_2780.context)->instPrimID[0];
                break;
              }
            }
            else {
              local_2780.context = context->user;
            }
            uVar40 = (ulong)(uVar39 * 4);
            local_2750 = *(float *)((long)local_2420 + uVar40);
            local_274c = *(undefined4 *)((long)local_2400 + uVar40);
            local_2748 = *(undefined4 *)((long)local_23e0 + uVar40);
            local_2744 = *(undefined4 *)(local_2480 + uVar40);
            local_2740 = *(undefined4 *)(local_2460 + uVar40);
            local_273c = *(undefined4 *)((long)&local_2620 + uVar40);
            local_2734 = (local_2780.context)->instID[0];
            local_2730 = (local_2780.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar40);
            local_27ac = -1;
            local_2780.valid = &local_27ac;
            local_2780.geometryUserPtr = pGVar8->userPtr;
            local_2780.ray = (RTCRayN *)ray;
            local_2780.hit = (RTCHitN *)&local_2750;
            local_2780.N = 1;
            local_2640 = auVar81._0_32_;
            if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c6e24f:
              if ((pRVar41->filter != (RTCFilterFunctionN)0x0) &&
                 (((pRVar41->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                (*pRVar41->filter)(&local_2780);
                auVar81 = ZEXT3264(local_2640);
                auVar108 = ZEXT3264(local_2720);
                auVar107 = ZEXT3264(local_2700);
                auVar106 = ZEXT3264(local_26e0);
                auVar105 = ZEXT3264(local_26c0);
                auVar104 = ZEXT3264(local_26a0);
                auVar103 = ZEXT3264(local_2680);
                if (*local_2780.valid == 0) goto LAB_01c6e32a;
              }
              (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.x =
                   *(float *)local_2780.hit;
              (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.y =
                   *(float *)(local_2780.hit + 4);
              (((Vec3f *)((long)local_2780.ray + 0x30))->field_0).field_0.z =
                   *(float *)(local_2780.hit + 8);
              *(float *)((long)local_2780.ray + 0x3c) = *(float *)(local_2780.hit + 0xc);
              *(float *)((long)local_2780.ray + 0x40) = *(float *)(local_2780.hit + 0x10);
              *(float *)((long)local_2780.ray + 0x44) = *(float *)(local_2780.hit + 0x14);
              *(float *)((long)local_2780.ray + 0x48) = *(float *)(local_2780.hit + 0x18);
              *(float *)((long)local_2780.ray + 0x4c) = *(float *)(local_2780.hit + 0x1c);
              *(float *)((long)local_2780.ray + 0x50) = *(float *)(local_2780.hit + 0x20);
            }
            else {
              local_27a8 = pRVar41;
              (*pGVar8->intersectionFilterN)(&local_2780);
              auVar81 = ZEXT3264(local_2640);
              auVar108 = ZEXT3264(local_2720);
              auVar107 = ZEXT3264(local_2700);
              auVar106 = ZEXT3264(local_26e0);
              auVar105 = ZEXT3264(local_26c0);
              auVar104 = ZEXT3264(local_26a0);
              auVar103 = ZEXT3264(local_2680);
              pRVar41 = local_27a8;
              if (*local_2780.valid != 0) goto LAB_01c6e24f;
LAB_01c6e32a:
              (ray->super_RayK<1>).tfar = (float)local_2660._0_4_;
            }
            fVar92 = (ray->super_RayK<1>).tfar;
            auVar27._4_4_ = fVar92;
            auVar27._0_4_ = fVar92;
            auVar27._8_4_ = fVar92;
            auVar27._12_4_ = fVar92;
            auVar27._16_4_ = fVar92;
            auVar27._20_4_ = fVar92;
            auVar27._24_4_ = fVar92;
            auVar27._28_4_ = fVar92;
            uVar20 = vcmpps_avx512vl(auVar81._0_32_,auVar27,2);
            uVar47 = (uint)(byte)(~(byte)(1 << (uVar22 & 0x1f)) & (byte)uVar47) & (uint)uVar20;
            uVar34 = (ray->super_RayK<1>).mask;
            auVar98 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
          }
          bVar38 = (byte)uVar47;
          if (bVar38 == 0) break;
          auVar80._8_4_ = 0x7f800000;
          auVar80._0_8_ = 0x7f8000007f800000;
          auVar80._12_4_ = 0x7f800000;
          auVar80._16_4_ = 0x7f800000;
          auVar80._20_4_ = 0x7f800000;
          auVar80._24_4_ = 0x7f800000;
          auVar80._28_4_ = 0x7f800000;
          auVar53 = vblendmps_avx512vl(auVar80,auVar81._0_32_);
          auVar77._0_4_ =
               (uint)(bVar38 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar38 & 1) * 0x7f800000;
          bVar46 = (bool)((byte)(uVar47 >> 1) & 1);
          auVar77._4_4_ = (uint)bVar46 * auVar53._4_4_ | (uint)!bVar46 * 0x7f800000;
          bVar46 = (bool)((byte)(uVar47 >> 2) & 1);
          auVar77._8_4_ = (uint)bVar46 * auVar53._8_4_ | (uint)!bVar46 * 0x7f800000;
          bVar46 = (bool)((byte)(uVar47 >> 3) & 1);
          auVar77._12_4_ = (uint)bVar46 * auVar53._12_4_ | (uint)!bVar46 * 0x7f800000;
          bVar46 = (bool)((byte)(uVar47 >> 4) & 1);
          auVar77._16_4_ = (uint)bVar46 * auVar53._16_4_ | (uint)!bVar46 * 0x7f800000;
          bVar46 = (bool)((byte)(uVar47 >> 5) & 1);
          auVar77._20_4_ = (uint)bVar46 * auVar53._20_4_ | (uint)!bVar46 * 0x7f800000;
          bVar46 = (bool)((byte)(uVar47 >> 6) & 1);
          auVar77._24_4_ = (uint)bVar46 * auVar53._24_4_ | (uint)!bVar46 * 0x7f800000;
          auVar77._28_4_ = (uVar47 >> 7) * auVar53._28_4_ | (uint)!SUB41(uVar47 >> 7,0) * 0x7f800000
          ;
          auVar53 = vshufps_avx(auVar77,auVar77,0xb1);
          auVar53 = vminps_avx(auVar77,auVar53);
          auVar54 = vshufpd_avx(auVar53,auVar53,5);
          auVar53 = vminps_avx(auVar53,auVar54);
          auVar54 = vpermpd_avx2(auVar53,0x4e);
          auVar53 = vminps_avx(auVar53,auVar54);
          uVar20 = vcmpps_avx512vl(auVar77,auVar53,0);
          bVar38 = (byte)uVar20 & bVar38;
        } while( true );
      }
    }
    auVar98 = ZEXT3264(local_25c0);
    auVar99 = ZEXT3264(local_25e0);
    auVar100 = ZEXT3264(local_2600);
    uVar40 = local_27a0;
    fVar78 = local_25a0;
    fVar92 = fStack_259c;
    fVar93 = fStack_2598;
    fVar94 = fStack_2594;
    fVar95 = fStack_2590;
    fVar96 = fStack_258c;
    fVar97 = fStack_2588;
  }
  fVar1 = (ray->super_RayK<1>).tfar;
  auVar81 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  auVar53 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar101 = ZEXT3264(auVar53);
  auVar102 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  goto LAB_01c6d684;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }